

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainAppendTerm(StrAccum *pStr,Index *pIdx,int nTerm,int iTerm,int bAnd,char *zOp)

{
  int in_ECX;
  int in_EDX;
  Index *in_RSI;
  char *in_RDI;
  int in_R8D;
  char *in_R9;
  int i;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = 0xaaaaaaaa;
  if (in_R8D != 0) {
    sqlite3_str_append((sqlite3_str *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,0);
  }
  if (1 < in_EDX) {
    sqlite3_str_append((sqlite3_str *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,0);
  }
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    if (iVar2 != 0) {
      sqlite3_str_append((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8,0);
    }
    in_stack_ffffffffffffffc8 = in_RDI;
    explainIndexColumnName(in_RSI,in_ECX + iVar2);
    sqlite3_str_appendall((sqlite3_str *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9);
  }
  if (1 < in_EDX) {
    sqlite3_str_append((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,0);
  }
  sqlite3_str_append((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,0);
  if (1 < in_EDX) {
    sqlite3_str_append((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,0);
  }
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    if (iVar2 != 0) {
      sqlite3_str_append((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8,0);
    }
    sqlite3_str_append((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,0);
  }
  if (1 < in_EDX) {
    sqlite3_str_append((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,0);
  }
  return;
}

Assistant:

static void explainAppendTerm(
  StrAccum *pStr,             /* The text expression being built */
  Index *pIdx,                /* Index to read column names from */
  int nTerm,                  /* Number of terms */
  int iTerm,                  /* Zero-based index of first term. */
  int bAnd,                   /* Non-zero to append " AND " */
  const char *zOp             /* Name of the operator */
){
  int i;

  assert( nTerm>=1 );
  if( bAnd ) sqlite3_str_append(pStr, " AND ", 5);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_appendall(pStr, explainIndexColumnName(pIdx, iTerm+i));
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);

  sqlite3_str_append(pStr, zOp, 1);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_append(pStr, "?", 1);
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);
}